

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forwarder-helper.c
# Opt level: O3

int tlv_data_get_name(uint8_t *data,size_t buflen,uint8_t **name,size_t *name_len)

{
  int iVar1;
  uint8_t *puVar2;
  uint32_t local_30;
  uint local_2c;
  uint32_t real_type;
  uint32_t real_len;
  
  puVar2 = tlv_get_type_length(data,buflen,&local_30,&local_2c);
  iVar1 = -0xe;
  if ((puVar2 != (uint8_t *)0x0) && (iVar1 = -0xc, local_30 == 6)) {
    iVar1 = -0xd;
    if (data + (buflen - (long)puVar2) == (uint8_t *)(ulong)local_2c) {
      *name = puVar2;
      puVar2 = tlv_get_type_length(puVar2,(size_t)(ulong)local_2c,&local_30,&local_2c);
      iVar1 = -0xe;
      if ((puVar2 != (uint8_t *)0x0) && (iVar1 = -0x11, local_30 == 7)) {
        *name_len = (ulong)local_2c;
        iVar1 = 0;
      }
    }
  }
  return iVar1;
}

Assistant:

int
tlv_data_get_name(uint8_t* data,
                  size_t buflen,
                  uint8_t** name,
                  size_t* name_len)
{
  uint32_t real_type, real_len;
  uint8_t* ptr;

  ptr = tlv_get_type_length(data, buflen, &real_type, &real_len);
  if(ptr == NULL){
    return NDN_OVERSIZE_VAR;
  }
  if(real_type != TLV_Data){
    return NDN_WRONG_TLV_TYPE;
  }
  if(real_len != buflen - (ptr - data)){
    return NDN_WRONG_TLV_LENGTH;
  }

  // Name
  *name = ptr;
  ptr = tlv_get_type_length(ptr, buflen - (ptr - data), &real_type, &real_len);
  if(ptr == NULL){
    return NDN_OVERSIZE_VAR;
  }
  if(real_type != TLV_Name){
    return NDN_UNSUPPORTED_FORMAT;
  }
  *name_len = real_len;

  return NDN_SUCCESS;
}